

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O0

void btFactorLDLT(btScalar *A,btScalar *d,int n,int nskip1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  float *pfVar5;
  int in_ECX;
  int in_EDX;
  float *in_RSI;
  btScalar *in_RDI;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  btScalar m22;
  btScalar Z22;
  btScalar m21;
  btScalar Z21;
  btScalar m11;
  btScalar Z11;
  btScalar q2;
  btScalar q1;
  btScalar p2;
  btScalar p1;
  btScalar dd;
  btScalar *dee;
  btScalar *ell;
  btScalar sum;
  int j;
  int i;
  float local_60;
  float local_58;
  float local_50;
  float *local_38;
  float *local_30;
  int local_20;
  int local_1c;
  
  if (0 < in_EDX) {
    for (local_1c = 0; local_38 = in_RSI, local_1c <= in_EDX + -2; local_1c = local_1c + 2) {
      btSolveL1_2(in_RDI,in_RDI + local_1c * in_ECX,local_1c,in_ECX);
      local_50 = 0.0;
      local_58 = 0.0;
      local_60 = 0.0;
      local_30 = in_RDI + local_1c * in_ECX;
      iVar4 = local_1c;
      while (local_20 = iVar4 + -6, -1 < local_20) {
        fVar1 = *local_30;
        fVar26 = local_30[in_ECX];
        fVar6 = fVar1 * *local_38;
        fVar7 = fVar26 * *local_38;
        *local_30 = fVar6;
        local_30[in_ECX] = fVar7;
        fVar18 = local_30[1];
        fVar19 = local_30[in_ECX + 1];
        fVar8 = fVar18 * local_38[1];
        fVar9 = fVar19 * local_38[1];
        local_30[1] = fVar8;
        local_30[in_ECX + 1] = fVar9;
        fVar2 = local_30[2];
        fVar3 = local_30[in_ECX + 2];
        fVar10 = fVar2 * local_38[2];
        fVar11 = fVar3 * local_38[2];
        local_30[2] = fVar10;
        local_30[in_ECX + 2] = fVar11;
        fVar20 = local_30[3];
        fVar21 = local_30[in_ECX + 3];
        fVar12 = fVar20 * local_38[3];
        fVar13 = fVar21 * local_38[3];
        local_30[3] = fVar12;
        local_30[in_ECX + 3] = fVar13;
        fVar22 = local_30[4];
        fVar23 = local_30[in_ECX + 4];
        fVar14 = fVar22 * local_38[4];
        fVar15 = fVar23 * local_38[4];
        local_30[4] = fVar14;
        local_30[in_ECX + 4] = fVar15;
        fVar24 = local_30[5];
        fVar25 = local_30[in_ECX + 5];
        fVar16 = fVar24 * local_38[5];
        fVar17 = fVar25 * local_38[5];
        local_30[5] = fVar16;
        local_30[in_ECX + 5] = fVar17;
        local_50 = fVar24 * fVar16 +
                   fVar22 * fVar14 +
                   fVar20 * fVar12 + fVar2 * fVar10 + fVar18 * fVar8 + fVar1 * fVar6 + local_50;
        local_58 = fVar25 * fVar16 +
                   fVar23 * fVar14 +
                   fVar21 * fVar12 + fVar3 * fVar10 + fVar19 * fVar8 + fVar26 * fVar6 + local_58;
        local_60 = fVar25 * fVar17 +
                   fVar23 * fVar15 +
                   fVar21 * fVar13 + fVar3 * fVar11 + fVar19 * fVar9 + fVar26 * fVar7 + local_60;
        local_30 = local_30 + 6;
        local_38 = local_38 + 6;
        iVar4 = local_20;
      }
      while (local_20 = iVar4, 0 < local_20) {
        fVar1 = *local_30;
        fVar26 = local_30[in_ECX];
        fVar18 = fVar1 * *local_38;
        fVar19 = fVar26 * *local_38;
        *local_30 = fVar18;
        local_30[in_ECX] = fVar19;
        local_50 = fVar1 * fVar18 + local_50;
        local_58 = fVar26 * fVar18 + local_58;
        local_60 = fVar26 * fVar19 + local_60;
        local_30 = local_30 + 1;
        local_38 = local_38 + 1;
        iVar4 = local_20 + -1;
      }
      fVar1 = local_30[in_ECX];
      fVar26 = local_30[in_ECX + 1];
      pfVar5 = in_RSI + local_1c;
      *pfVar5 = 1.0 / (*local_30 - local_50);
      fVar18 = (fVar1 - local_58) * *pfVar5;
      pfVar5[1] = 1.0 / ((fVar26 - local_60) - ((fVar1 - local_58) * fVar18 + 0.0));
      local_30[in_ECX] = fVar18;
    }
    if ((in_EDX != local_1c) && (in_EDX - local_1c == 1)) {
      btSolveL1_1(in_RDI,in_RDI + local_1c * in_ECX,local_1c,in_ECX);
      local_50 = 0.0;
      local_30 = in_RDI + local_1c * in_ECX;
      iVar4 = local_1c;
      while (local_20 = iVar4 + -6, -1 < local_20) {
        fVar1 = *local_30;
        fVar20 = fVar1 * *local_38;
        *local_30 = fVar20;
        fVar26 = local_30[1];
        fVar21 = fVar26 * local_38[1];
        local_30[1] = fVar21;
        fVar18 = local_30[2];
        fVar22 = fVar18 * local_38[2];
        local_30[2] = fVar22;
        fVar19 = local_30[3];
        fVar23 = fVar19 * local_38[3];
        local_30[3] = fVar23;
        fVar2 = local_30[4];
        fVar24 = fVar2 * local_38[4];
        local_30[4] = fVar24;
        fVar3 = local_30[5];
        fVar25 = fVar3 * local_38[5];
        local_30[5] = fVar25;
        local_50 = fVar3 * fVar25 +
                   fVar2 * fVar24 +
                   fVar19 * fVar23 + fVar18 * fVar22 + fVar26 * fVar21 + fVar1 * fVar20 + local_50;
        local_30 = local_30 + 6;
        local_38 = local_38 + 6;
        iVar4 = local_20;
      }
      while (local_20 = iVar4, 0 < local_20) {
        fVar1 = *local_30;
        fVar26 = fVar1 * *local_38;
        *local_30 = fVar26;
        local_50 = fVar1 * fVar26 + local_50;
        local_30 = local_30 + 1;
        local_38 = local_38 + 1;
        iVar4 = local_20 + -1;
      }
      in_RSI[local_1c] = 1.0 / (*local_30 - local_50);
    }
  }
  return;
}

Assistant:

void btFactorLDLT (btScalar *A, btScalar *d, int n, int nskip1)
{  
  int i,j;
  btScalar sum,*ell,*dee,dd,p1,p2,q1,q2,Z11,m11,Z21,m21,Z22,m22;
  if (n < 1) return;
  
  for (i=0; i<=n-2; i += 2) {
    /* solve L*(D*l)=a, l is scaled elements in 2 x i block at A(i,0) */
    btSolveL1_2 (A,A+i*nskip1,i,nskip1);
    /* scale the elements in a 2 x i block at A(i,0), and also */
    /* compute Z = the outer product matrix that we'll need. */
    Z11 = 0;
    Z21 = 0;
    Z22 = 0;
    ell = A+i*nskip1;
    dee = d;
    for (j=i-6; j >= 0; j -= 6) {
      p1 = ell[0];
      p2 = ell[nskip1];
      dd = dee[0];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[0] = q1;
      ell[nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[1];
      p2 = ell[1+nskip1];
      dd = dee[1];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[1] = q1;
      ell[1+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[2];
      p2 = ell[2+nskip1];
      dd = dee[2];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[2] = q1;
      ell[2+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[3];
      p2 = ell[3+nskip1];
      dd = dee[3];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[3] = q1;
      ell[3+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[4];
      p2 = ell[4+nskip1];
      dd = dee[4];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[4] = q1;
      ell[4+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[5];
      p2 = ell[5+nskip1];
      dd = dee[5];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[5] = q1;
      ell[5+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      ell += 6;
      dee += 6;
    }
    /* compute left-over iterations */
    j += 6;
    for (; j > 0; j--) {
      p1 = ell[0];
      p2 = ell[nskip1];
      dd = dee[0];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[0] = q1;
      ell[nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      ell++;
      dee++;
    }
    /* solve for diagonal 2 x 2 block at A(i,i) */
    Z11 = ell[0] - Z11;
    Z21 = ell[nskip1] - Z21;
    Z22 = ell[1+nskip1] - Z22;
    dee = d + i;
    /* factorize 2 x 2 block Z,dee */
    /* factorize row 1 */
    dee[0] = btRecip(Z11);
    /* factorize row 2 */
    sum = 0;
    q1 = Z21;
    q2 = q1 * dee[0];
    Z21 = q2;
    sum += q1*q2;
    dee[1] = btRecip(Z22 - sum);
    /* done factorizing 2 x 2 block */
    ell[nskip1] = Z21;
  }
  /* compute the (less than 2) rows at the bottom */
  switch (n-i) {
    case 0:
    break;
    
    case 1:
    btSolveL1_1 (A,A+i*nskip1,i,nskip1);
    /* scale the elements in a 1 x i block at A(i,0), and also */
    /* compute Z = the outer product matrix that we'll need. */
    Z11 = 0;
    ell = A+i*nskip1;
    dee = d;
    for (j=i-6; j >= 0; j -= 6) {
      p1 = ell[0];
      dd = dee[0];
      q1 = p1*dd;
      ell[0] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[1];
      dd = dee[1];
      q1 = p1*dd;
      ell[1] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[2];
      dd = dee[2];
      q1 = p1*dd;
      ell[2] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[3];
      dd = dee[3];
      q1 = p1*dd;
      ell[3] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[4];
      dd = dee[4];
      q1 = p1*dd;
      ell[4] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[5];
      dd = dee[5];
      q1 = p1*dd;
      ell[5] = q1;
      m11 = p1*q1;
      Z11 += m11;
      ell += 6;
      dee += 6;
    }
    /* compute left-over iterations */
    j += 6;
    for (; j > 0; j--) {
      p1 = ell[0];
      dd = dee[0];
      q1 = p1*dd;
      ell[0] = q1;
      m11 = p1*q1;
      Z11 += m11;
      ell++;
      dee++;
    }
    /* solve for diagonal 1 x 1 block at A(i,i) */
    Z11 = ell[0] - Z11;
    dee = d + i;
    /* factorize 1 x 1 block Z,dee */
    /* factorize row 1 */
    dee[0] = btRecip(Z11);
    /* done factorizing 1 x 1 block */
    break;
    
    //default: *((char*)0)=0;  /* this should never happen! */
  }
}